

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BayesianProbitRegressor::BayesianProbitRegressor
          (BayesianProbitRegressor *this,BayesianProbitRegressor *from)

{
  void *pvVar1;
  string *psVar2;
  BayesianProbitRegressor_Gaussian *from_00;
  BayesianProbitRegressor_Gaussian *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__BayesianProbitRegressor_003c5000
  ;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->features_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->features_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->features_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->features_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
            (&(this->features_).super_RepeatedPtrFieldBase,
             &(from->features_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->regressioninputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->regressioninputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->regressioninputfeaturename_,psVar2);
  }
  (this->optimisminputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->optimisminputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->optimisminputfeaturename_,psVar2);
  }
  (this->samplingscaleinputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->samplingscaleinputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->samplingscaleinputfeaturename_,psVar2);
  }
  (this->samplingtruncationinputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->samplingtruncationinputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->samplingtruncationinputfeaturename_,psVar2);
  }
  (this->meanoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->meanoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->meanoutputfeaturename_,psVar2);
  }
  (this->varianceoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->varianceoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->varianceoutputfeaturename_,psVar2);
  }
  (this->pessimisticprobabilityoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->pessimisticprobabilityoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->pessimisticprobabilityoutputfeaturename_,psVar2);
  }
  (this->sampledprobabilityoutputfeaturename_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->sampledprobabilityoutputfeaturename_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this->sampledprobabilityoutputfeaturename_,psVar2);
  }
  from_00 = from->bias_;
  if (from_00 == (BayesianProbitRegressor_Gaussian *)0x0 ||
      from == (BayesianProbitRegressor *)&_BayesianProbitRegressor_default_instance_) {
    this_00 = (BayesianProbitRegressor_Gaussian *)0x0;
  }
  else {
    this_00 = (BayesianProbitRegressor_Gaussian *)operator_new(0x28);
    BayesianProbitRegressor_Gaussian::BayesianProbitRegressor_Gaussian(this_00,from_00);
  }
  this->bias_ = this_00;
  this->numberoffeatures_ = from->numberoffeatures_;
  return;
}

Assistant:

BayesianProbitRegressor::BayesianProbitRegressor(const BayesianProbitRegressor& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      features_(from.features_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  regressioninputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.regressioninputfeaturename().size() > 0) {
    regressioninputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.regressioninputfeaturename_);
  }
  optimisminputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.optimisminputfeaturename().size() > 0) {
    optimisminputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.optimisminputfeaturename_);
  }
  samplingscaleinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.samplingscaleinputfeaturename().size() > 0) {
    samplingscaleinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.samplingscaleinputfeaturename_);
  }
  samplingtruncationinputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.samplingtruncationinputfeaturename().size() > 0) {
    samplingtruncationinputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.samplingtruncationinputfeaturename_);
  }
  meanoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.meanoutputfeaturename().size() > 0) {
    meanoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.meanoutputfeaturename_);
  }
  varianceoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.varianceoutputfeaturename().size() > 0) {
    varianceoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.varianceoutputfeaturename_);
  }
  pessimisticprobabilityoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.pessimisticprobabilityoutputfeaturename().size() > 0) {
    pessimisticprobabilityoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.pessimisticprobabilityoutputfeaturename_);
  }
  sampledprobabilityoutputfeaturename_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.sampledprobabilityoutputfeaturename().size() > 0) {
    sampledprobabilityoutputfeaturename_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.sampledprobabilityoutputfeaturename_);
  }
  if (from.has_bias()) {
    bias_ = new ::CoreML::Specification::BayesianProbitRegressor_Gaussian(*from.bias_);
  } else {
    bias_ = NULL;
  }
  numberoffeatures_ = from.numberoffeatures_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BayesianProbitRegressor)
}